

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O3

Hcell * machineAtAddr(Hcell *__return_storage_ptr__,Machine *m,Addr a)

{
  pointer pcVar1;
  Hix HVar2;
  mapped_type *pmVar3;
  key_type local_20;
  key_type local_1c;
  
  if (a.tag_ == Heap) {
    local_1c.hix = a.hix_.hix.hix;
    pmVar3 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&local_1c);
  }
  else {
    if (a.tag_ != Reg) {
      __assert_fail("false && \"unreachable\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                    ,0x104,"Hcell machineAtAddr(Machine, Addr)");
    }
    local_20.r = (int)a.r_.r;
    pmVar3 = std::
             map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
             ::operator[](&m->regval,&local_20);
  }
  HVar2.hix = (pmVar3->hix_).hix;
  __return_storage_ptr__->tag = pmVar3->tag;
  __return_storage_ptr__->hix_ = (Hix)HVar2.hix;
  (__return_storage_ptr__->f_).id._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->f_).id.field_2;
  pcVar1 = (pmVar3->f_).id._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->f_,pcVar1,pcVar1 + (pmVar3->f_).id._M_string_length)
  ;
  (__return_storage_ptr__->f_).arity = (pmVar3->f_).arity;
  return __return_storage_ptr__;
}

Assistant:

Hcell machineAtAddr(Machine m, Addr a) {
    switch (a.tag()) {
        case AddrTag::Reg:
            return m.regval[a.r()];
        case AddrTag::Heap:
            return m.heap[a.hix()];
    }
    assert(false && "unreachable");
}